

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O3

bool __thiscall
tinyusdz::Prim::replace_child(Prim *this,string *child_prim_name,Prim *rhs,string *err)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  _Alloc_hider __s2;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  string *psVar7;
  char *pcVar8;
  char *pcVar9;
  pointer this_01;
  pointer pPVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  string local_180;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_160;
  pointer local_158;
  string *local_150;
  Path local_148;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  psVar7 = err;
  if ((err != (string *)0x0) && (child_prim_name->_M_string_length == 0)) {
    std::__cxx11::string::append((char *)err);
  }
  bVar4 = ValidatePrimElementName(child_prim_name);
  if ((err != (string *)0x0) && (!bVar4)) {
    local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_180,"`{}` is not a valid Prim name.\n","");
    fmt::format<std::__cxx11::string>
              (&local_148._prim_part,(fmt *)&local_180,child_prim_name,psVar7);
    std::__cxx11::string::_M_append((char *)err,(ulong)local_148._prim_part._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      local_148._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
  }
  this_01 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pPVar10 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_160 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->_childrenNameSet;
  if (((long)pPVar10 - (long)this_01 >> 4) * 0x21cfb2b78c13521d -
      (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_160,
               (_Link_type)
               (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    p_Var1 = &(this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (this->_childrenNameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    this_01 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pPVar10 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (pPVar10 != this_01) {
      lVar11 = 0x1a0;
      uVar13 = 0;
      do {
        this_00 = local_160;
        if (*(long *)((long)&(this_01->_abs_path)._prim_part._M_string_length + lVar11) == 0) {
          if (err == (string *)0x0) {
            return false;
          }
          pcVar9 = (char *)err->_M_string_length;
          pcVar8 = "Internal error: Existing child Prim\'s elementName is empty.\n";
LAB_001349fd:
          std::__cxx11::string::_M_replace((ulong)err,0,pcVar9,(ulong)pcVar8);
          return false;
        }
        sVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_160,
                        (key_type *)
                        ((long)&(this_01->_abs_path)._prim_part._M_dataplus._M_p + lVar11));
        if (sVar6 != 0) {
          if (err == (string *)0x0) {
            return false;
          }
          pcVar9 = (char *)err->_M_string_length;
          pcVar8 = "Internal error: _children contains Prim with same elementName.\n";
          goto LAB_001349fd;
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_equal<std::__cxx11::string_const&>
                  (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&(((this->_children).
                                     super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_abs_path).
                                   _prim_part._M_dataplus + lVar11));
        uVar13 = uVar13 + 1;
        this_01 = (this->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pPVar10 = (this->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar11 = lVar11 + 0x350;
      } while (uVar13 < (ulong)(((long)pPVar10 - (long)this_01 >> 4) * 0x21cfb2b78c13521d));
    }
  }
  local_70 = local_60;
  pcVar3 = (child_prim_name->_M_dataplus)._M_p;
  local_150 = child_prim_name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + child_prim_name->_M_string_length);
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_70,local_68 + (long)local_70);
  paVar2 = &local_148._prim_part.field_2;
  local_148._prim_part._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_148,local_50,local_48 + (long)local_50)
  ;
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_180,local_148._prim_part._M_dataplus._M_p,
             local_148._prim_part._M_dataplus._M_p + local_148._prim_part._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._prim_part._M_dataplus._M_p != paVar2) {
    operator_delete(local_148._prim_part._M_dataplus._M_p,
                    local_148._prim_part.field_2._M_allocated_capacity + 1);
  }
  local_148._prim_part._M_dataplus._M_p = (pointer)&local_148._prim_part.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148,local_180._M_dataplus._M_p,
             local_180._M_dataplus._M_p + local_180._M_string_length);
  __s2._M_p = local_148._prim_part._M_dataplus._M_p;
  lVar11 = (long)pPVar10 - (long)this_01;
  lVar12 = (lVar11 >> 4) * 0x21cfb2b78c13521d >> 2;
  if (0 < lVar12) {
    local_158 = this_01 + lVar12 * 4;
    lVar12 = lVar12 + 1;
    this_01 = this_01 + 2;
    do {
      if (this_01[-2]._elementPath._prim_part._M_string_length ==
          local_148._prim_part._M_string_length) {
        if ((local_148._prim_part._M_string_length == 0) ||
           (iVar5 = bcmp(this_01[-2]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,
                         local_148._prim_part._M_string_length), iVar5 == 0)) {
          this_01 = this_01 + -2;
          goto LAB_00134a21;
        }
        if (this_01[-1]._elementPath._prim_part._M_string_length ==
            local_148._prim_part._M_string_length) goto LAB_0013484f;
      }
      else if (this_01[-1]._elementPath._prim_part._M_string_length ==
               local_148._prim_part._M_string_length) {
        if (local_148._prim_part._M_string_length != 0) {
LAB_0013484f:
          iVar5 = bcmp(this_01[-1]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,
                       local_148._prim_part._M_string_length);
          if (iVar5 != 0) goto LAB_00134869;
        }
        this_01 = this_01 + -1;
        goto LAB_00134a21;
      }
LAB_00134869:
      if ((this_01->_elementPath)._prim_part._M_string_length ==
          local_148._prim_part._M_string_length) {
        if ((local_148._prim_part._M_string_length == 0) ||
           (iVar5 = bcmp((this_01->_elementPath)._prim_part._M_dataplus._M_p,__s2._M_p,
                         local_148._prim_part._M_string_length), iVar5 == 0)) goto LAB_00134a21;
        if (this_01[1]._elementPath._prim_part._M_string_length ==
            local_148._prim_part._M_string_length) {
LAB_001348b2:
          iVar5 = bcmp(this_01[1]._elementPath._prim_part._M_dataplus._M_p,__s2._M_p,
                       local_148._prim_part._M_string_length);
          if (iVar5 == 0) goto LAB_00134a12;
        }
      }
      else if (this_01[1]._elementPath._prim_part._M_string_length ==
               local_148._prim_part._M_string_length) {
        if (local_148._prim_part._M_string_length != 0) goto LAB_001348b2;
LAB_00134a12:
        this_01 = this_01 + 1;
        goto LAB_00134a21;
      }
      lVar12 = lVar12 + -1;
      this_01 = this_01 + 4;
    } while (1 < lVar12);
    lVar11 = (long)pPVar10 - (long)local_158;
    this_01 = local_158;
  }
  lVar11 = (lVar11 >> 4) * 0x21cfb2b78c13521d;
  if (lVar11 == 1) {
LAB_00134983:
    if (((this_01->_elementPath)._prim_part._M_string_length !=
         local_148._prim_part._M_string_length) ||
       ((local_148._prim_part._M_string_length != 0 &&
        (iVar5 = bcmp((this_01->_elementPath)._prim_part._M_dataplus._M_p,__s2._M_p,
                      local_148._prim_part._M_string_length), iVar5 != 0)))) {
LAB_001349ab:
      this_01 = pPVar10;
    }
  }
  else if (lVar11 == 2) {
LAB_00134950:
    if (((this_01->_elementPath)._prim_part._M_string_length !=
         local_148._prim_part._M_string_length) ||
       ((local_148._prim_part._M_string_length != 0 &&
        (iVar5 = bcmp((this_01->_elementPath)._prim_part._M_dataplus._M_p,__s2._M_p,
                      local_148._prim_part._M_string_length), iVar5 != 0)))) {
      this_01 = this_01 + 1;
      goto LAB_00134983;
    }
  }
  else {
    if (lVar11 != 3) goto LAB_001349ab;
    if (((this_01->_elementPath)._prim_part._M_string_length !=
         local_148._prim_part._M_string_length) ||
       ((local_148._prim_part._M_string_length != 0 &&
        (iVar5 = bcmp((this_01->_elementPath)._prim_part._M_dataplus._M_p,__s2._M_p,
                      local_148._prim_part._M_string_length), iVar5 != 0)))) {
      this_01 = this_01 + 1;
      goto LAB_00134950;
    }
  }
LAB_00134a21:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s2._M_p != &local_148._prim_part.field_2) {
    operator_delete(__s2._M_p,local_148._prim_part.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_180.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != paVar2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  psVar7 = local_150;
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  pPVar10 = (this->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = SetPrimElementName(&rhs->_data,psVar7);
  local_180._M_dataplus._M_p = (pointer)paVar2;
  if (this_01 == pPVar10) {
    if (!bVar4) goto LAB_00134e47;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
    Path::Path(&local_148,psVar7,&local_180);
    Path::operator=(&rhs->_elementPath,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._element._M_dataplus._M_p != &local_148._element.field_2) {
      operator_delete(local_148._element._M_dataplus._M_p,
                      local_148._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part_str._M_dataplus._M_p != &local_148._variant_part_str.field_2) {
      operator_delete(local_148._variant_part_str._M_dataplus._M_p,
                      local_148._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_selection_part._M_dataplus._M_p !=
        &local_148._variant_selection_part.field_2) {
      operator_delete(local_148._variant_selection_part._M_dataplus._M_p,
                      local_148._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part._M_dataplus._M_p != &local_148._variant_part.field_2) {
      operator_delete(local_148._variant_part._M_dataplus._M_p,
                      local_148._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prop_part._M_dataplus._M_p != &local_148._prop_part.field_2) {
      operator_delete(local_148._prop_part._M_dataplus._M_p,
                      local_148._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      local_148._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != paVar2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_equal<std::__cxx11::string_const&>(local_160,psVar7);
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
              (&this->_children,rhs);
  }
  else {
    if (!bVar4) {
LAB_00134e47:
      if (err != (string *)0x0) {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_180,"Internal error. cannot modify Prim\'s elementName.\n","");
        fmt::format(&local_148._prim_part,&local_180);
        std::__cxx11::string::operator=((string *)err,(string *)&local_148);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
          operator_delete(local_148._prim_part._M_dataplus._M_p,
                          local_148._prim_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != paVar2) {
          operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
        }
      }
      return false;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
    Path::Path(&local_148,psVar7,&local_180);
    Path::operator=(&rhs->_elementPath,&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._element._M_dataplus._M_p != &local_148._element.field_2) {
      operator_delete(local_148._element._M_dataplus._M_p,
                      local_148._element.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part_str._M_dataplus._M_p != &local_148._variant_part_str.field_2) {
      operator_delete(local_148._variant_part_str._M_dataplus._M_p,
                      local_148._variant_part_str.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_selection_part._M_dataplus._M_p !=
        &local_148._variant_selection_part.field_2) {
      operator_delete(local_148._variant_selection_part._M_dataplus._M_p,
                      local_148._variant_selection_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._variant_part._M_dataplus._M_p != &local_148._variant_part.field_2) {
      operator_delete(local_148._variant_part._M_dataplus._M_p,
                      local_148._variant_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prop_part._M_dataplus._M_p != &local_148._prop_part.field_2) {
      operator_delete(local_148._prop_part._M_dataplus._M_p,
                      local_148._prop_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._prim_part._M_dataplus._M_p != &local_148._prim_part.field_2) {
      operator_delete(local_148._prim_part._M_dataplus._M_p,
                      local_148._prim_part.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_180._M_dataplus._M_p != &local_180.field_2) {
      operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
    }
    Path::operator=(&this_01->_abs_path,&rhs->_abs_path);
    Path::operator=(&this_01->_path,&rhs->_path);
    Path::operator=(&this_01->_elementPath,&rhs->_elementPath);
    std::__cxx11::string::operator=
              ((string *)&this_01->_prim_type_name,(string *)&rhs->_prim_type_name);
    this_01->_specifier = rhs->_specifier;
    linb::any::operator=(&(this_01->_data).v_,&(rhs->_data).v_);
    local_148._prim_part.field_2._M_allocated_capacity =
         (size_type)
         (this_01->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    pPVar10 = (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    local_148._prim_part._M_dataplus._M_p =
         (pointer)(this_01->_children).
                  super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_148._prim_part._M_string_length =
         (size_type)
         (this_01->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this_01->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
    .super__Vector_impl_data._M_start =
         (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this_01->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
    .super__Vector_impl_data._M_finish = pPVar10;
    (this_01->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage =
         (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (rhs->_children).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::~vector
              ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)&local_148);
    std::
    multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this_01->_childrenNameSet,&rhs->_childrenNameSet);
    bVar4 = rhs->_primChildrenIndicesIsValid;
    this_01->_child_dirty = rhs->_child_dirty;
    this_01->_primChildrenIndicesIsValid = bVar4;
    std::vector<long,_std::allocator<long>_>::_M_move_assign
              (&this_01->_primChildrenIndices,&rhs->_primChildrenIndices);
    this_01->_prim_id = rhs->_prim_id;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSet>_>_>
    ::operator=(&this_01->_variantSets,&rhs->_variantSets);
  }
  this->_child_dirty = true;
  return true;
}

Assistant:

bool Prim::replace_child(const std::string &child_prim_name, Prim &&rhs,
                         std::string *err) {
#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (child_prim_name.empty()) {
    if (err) {
      (*err) += "child_prim_name is empty.\n";
    }
  }

  if (!ValidatePrimElementName(child_prim_name)) {
    if (err) {
      (*err) +=
          fmt::format("`{}` is not a valid Prim name.\n", child_prim_name);
    }
  }

  if (_children.size() != _childrenNameSet.size()) {
    // Rebuild _childrenNames
    _childrenNameSet.clear();
    for (size_t i = 0; i < _children.size(); i++) {
      if (_children[i].element_name().empty()) {
        if (err) {
          (*err) =
              "Internal error: Existing child Prim's elementName is empty.\n";
        }
        return false;
      }

      if (_childrenNameSet.count(_children[i].element_name())) {
        if (err) {
          (*err) =
              "Internal error: _children contains Prim with same "
              "elementName.\n";
        }
        return false;
      }

      _childrenNameSet.insert(_children[i].element_name());
    }
  }

  // Simple linear scan
  auto result = std::find_if(_children.begin(), _children.end(),
                             [child_prim_name](const Prim &p) {
                               return (p.element_name() == child_prim_name);
                             });

  if (result != _children.end()) {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    (*result) = std::move(rhs);  // replace

  } else {
    // Need to modify both Prim::data::name and Prim::elementPath
    if (!SetPrimElementName(rhs.get_data(), child_prim_name)) {
      if (err) {
        (*err) =
            fmt::format("Internal error. cannot modify Prim's elementName.\n");
      }
      return false;
    }
    rhs.element_path() = Path(child_prim_name, /* prop_part */ "");

    _childrenNameSet.insert(child_prim_name);
    _children.emplace_back(std::move(rhs));  // add
  }

  _child_dirty = true;

  return true;
}